

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

void __thiscall MidiApi::~MidiApi(MidiApi *this)

{
  MidiApi *this_local;
  
  this->_vptr_MidiApi = (_func_int **)&PTR__MidiApi_00126a78;
  std::__cxx11::string::~string((string *)&this->errorString_);
  return;
}

Assistant:

MidiApi :: ~MidiApi( void )
{
}